

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldAccessor::Clear(MapFieldAccessor *this,Field *data)

{
  MutableRepeatedField((Field *)0x42f258);
  RepeatedPtrField<google::protobuf::Message>::Clear
            ((RepeatedPtrField<google::protobuf::Message> *)0x42f260);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }